

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

string * duckdb::Timestamp::UnsupportedTimezoneError_abi_cxx11_(string_t str)

{
  undefined1 *puVar1;
  undefined1 *in_RDX;
  uint in_ESI;
  string *in_RDI;
  string local_48;
  undefined1 auStack_24 [12];
  
  puVar1 = auStack_24;
  if (0xc < in_ESI) {
    puVar1 = in_RDX;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,puVar1,puVar1 + in_ESI);
  UnsupportedTimezoneError(in_RDI,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

string Timestamp::UnsupportedTimezoneError(string_t str) {
	return Timestamp::UnsupportedTimezoneError(str.GetString());
}